

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  ostream *poVar1;
  TestInfo *test_info;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *result;
  int i;
  int i_00;
  string kTestsuite;
  allocator local_95;
  int local_94;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"testsuite",(allocator *)&local_90);
  poVar1 = std::operator<<(stream,"  <");
  std::operator<<(poVar1,(string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_94);
  std::__cxx11::string::string((string *)&local_70,(test_suite->name_)._M_dataplus._M_p,&local_95);
  OutputXmlAttribute(stream,&local_50,&local_90,&local_70);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_90,"tests",&local_95);
  local_94 = TestSuite::reportable_test_count(test_suite);
  StreamableToString<int>(&local_70,&local_94);
  OutputXmlAttribute(stream,&local_50,&local_90,&local_70);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string((string *)&local_90,"failures",&local_95);
    local_94 = TestSuite::failed_test_count(test_suite);
    StreamableToString<int>(&local_70,&local_94);
    OutputXmlAttribute(stream,&local_50,&local_90,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string((string *)&local_90,"disabled",&local_95);
    local_94 = TestSuite::reportable_disabled_test_count(test_suite);
    StreamableToString<int>(&local_70,&local_94);
    OutputXmlAttribute(stream,&local_50,&local_90,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string((string *)&local_90,"errors",(allocator *)&local_94);
    std::__cxx11::string::string((string *)&local_70,"0",&local_95);
    OutputXmlAttribute(stream,&local_50,&local_90,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string((string *)&local_90,"time",(allocator *)&local_94);
    FormatTimeInMillisAsSeconds_abi_cxx11_(&local_70,(internal *)test_suite->elapsed_time_,ms);
    OutputXmlAttribute(stream,&local_50,&local_90,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string((string *)&local_90,"timestamp",(allocator *)&local_94);
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_
              (&local_70,(internal *)test_suite->start_timestamp_,ms_00);
    OutputXmlAttribute(stream,&local_50,&local_90,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    TestPropertiesAsXmlAttributes_abi_cxx11_
              (&local_90,(XmlUnitTestResultPrinter *)&test_suite->ad_hoc_test_result_,result);
    std::operator<<(stream,(string *)&local_90);
    std::__cxx11::string::_M_dispose();
  }
  std::operator<<(stream,">\n");
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(test_suite->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(test_suite->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    test_info = TestSuite::GetTestInfo(test_suite,i_00);
    if ((test_info->matches_filter_ == true) && ((test_info->is_in_another_shard_ & 1U) == 0)) {
      OutputXmlTestInfo(stream,(test_suite->name_)._M_dataplus._M_p,test_info);
    }
  }
  poVar1 = std::operator<<(stream,"  </");
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestSuite(std::ostream* stream,
                                                 const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_suite.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_suite.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_suite.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_suite.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "errors", "0");
    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_suite.elapsed_time()));
    OutputXmlAttribute(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsIso8601(test_suite.start_timestamp()));
    *stream << TestPropertiesAsXmlAttributes(test_suite.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}